

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * validateEmbeddingWeightsBias
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,WeightParams *weights,
                   WeightParams *bias)

{
  string *psVar1;
  bool bVar2;
  WeightParamType WVar3;
  WeightParamType WVar4;
  EmbeddingLayerParams *pEVar5;
  EmbeddingNDLayerParams *pEVar6;
  uint64 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  byte bVar8;
  uint64_t local_e8;
  string err;
  undefined1 local_c0 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string layer_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  CoreML::Result::Result(__return_storage_ptr__);
  layer_type._M_dataplus._M_p = (pointer)&layer_type.field_2;
  layer_type._M_string_length = 0;
  layer_type.field_2._M_local_buf[0] = '\0';
  if (layer->_oneof_case_[0] == 0x410) {
    pEVar6 = CoreML::Specification::NeuralNetworkLayer::embeddingnd(layer);
    uVar7 = pEVar6->vocabsize_;
    local_e8 = pEVar6->embeddingsize_;
    bVar8 = pEVar6->hasbias_;
    std::__cxx11::string::assign((char *)&layer_type);
  }
  else {
    if (layer->_oneof_case_[0] != 0x96) goto LAB_0059849d;
    pEVar5 = CoreML::Specification::NeuralNetworkLayer::embedding(layer);
    uVar7 = pEVar5->inputdim_;
    local_e8 = pEVar5->outputchannels_;
    bVar8 = pEVar5->hasbias_;
    std::__cxx11::string::assign((char *)&layer_type);
  }
  WVar3 = CoreML::valueType(weights);
  WVar4 = CoreML::valueType(bias);
  if ((WVar3 == UNSPECIFIED) || ((WVar4 == UNSPECIFIED & bVar8) != 0)) {
    std::operator+(&local_98,&layer_type," \'");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   &local_98,(layer->name_).ptr_);
    std::operator+(&err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_c0,
                   "\' has invalid weights/bias fields. Field value types should match and should either be half or full precision."
                  );
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)&local_98);
    CoreML::Result::Result((Result *)local_c0,INVALID_MODEL_PARAMETERS,&err);
    CoreML::Result::operator=(__return_storage_ptr__,(Result *)local_c0);
    std::__cxx11::string::~string((string *)(local_c0 + 8));
    this = &err;
  }
  else {
    if ((bVar8 == 0) ||
       ((WVar3 != FLOAT16 || WVar4 != FLOAT32 && (WVar3 != FLOAT32 || WVar4 != FLOAT16)))) {
      psVar1 = (layer->name_).ptr_;
      std::__cxx11::string::string((string *)&err,"weight",(allocator *)&local_98);
      CoreML::validateGeneralWeightParams
                ((Result *)local_c0,weights,uVar7 * local_e8,local_e8,&layer_type,psVar1,&err);
      CoreML::Result::operator=(__return_storage_ptr__,(Result *)local_c0);
      std::__cxx11::string::~string((string *)(local_c0 + 8));
      std::__cxx11::string::~string((string *)&err);
      bVar2 = CoreML::Result::good(__return_storage_ptr__);
      if ((bVar2 & bVar8) != 0) {
        psVar1 = (layer->name_).ptr_;
        std::__cxx11::string::string((string *)&err,"bias",(allocator *)&local_98);
        CoreML::validateGeneralWeightParams
                  ((Result *)local_c0,bias,local_e8,1,&layer_type,psVar1,&err);
        CoreML::Result::operator=(__return_storage_ptr__,(Result *)local_c0);
        std::__cxx11::string::~string((string *)(local_c0 + 8));
        std::__cxx11::string::~string((string *)&err);
        CoreML::Result::good(__return_storage_ptr__);
      }
      goto LAB_0059849d;
    }
    std::operator+(&local_50,&layer_type," layer \'");
    std::operator+(&local_98,&local_50,(layer->name_).ptr_);
    std::operator+(&err,&local_98,
                   "has unmatched precisions of weights/bias They should either be half or full precision."
                  );
    CoreML::Result::Result((Result *)local_c0,INVALID_MODEL_PARAMETERS,&err);
    CoreML::Result::operator=(__return_storage_ptr__,(Result *)local_c0);
    std::__cxx11::string::~string((string *)(local_c0 + 8));
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::~string((string *)&local_98);
    this = &local_50;
  }
  std::__cxx11::string::~string((string *)this);
LAB_0059849d:
  std::__cxx11::string::~string((string *)&layer_type);
  return __return_storage_ptr__;
}

Assistant:

static Result validateEmbeddingWeightsBias(const Specification::NeuralNetworkLayer& layer,
                                              const Specification::WeightParams& weights,
                                              const Specification::WeightParams& bias) {

    Result r;

    bool has_bias;
    uint64_t input_dim;
    uint64_t output_channels;
    std::string layer_type;

    switch(layer.layer_case()) {
        case Specification::NeuralNetworkLayer::LayerCase::kEmbedding: {
            const auto& params = layer.embedding();
            input_dim = params.inputdim();
            output_channels = params.outputchannels();
            has_bias = params.hasbias();
            layer_type = "Embedding";
            break;
        }
        case Specification::NeuralNetworkLayer::LayerCase::kEmbeddingND: {
            const auto& params = layer.embeddingnd();
            input_dim = params.vocabsize();
            output_channels = params.embeddingsize();
            has_bias = params.hasbias();
            layer_type = "EmbeddingND";
            break;
        }
        default:
            return r;
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(weights);
    biasValueType = valueType(bias);

    // Only float32 or float16 parameters can be populated at any time
    if ((weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)){
        std::string err = layer_type + " '" + layer.name() + "' has invalid weights/bias fields. Field value types should match and should either be half or full precision.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, layer_type + " layer '" + layer.name() +
                       "has unmatched precisions of weights/bias They should either be half or full precision.");
            return r;
        }
    }
    // Validate weight and bias sizes
    r = validateGeneralWeightParams(weights, input_dim * output_channels, output_channels,
                                    layer_type, layer.name(), "weight");
    if (!r.good()) return r;
    if (has_bias){
        r = validateGeneralWeightParams(bias, output_channels, 1,
                                        layer_type, layer.name(), "bias");
        if (!r.good()) return r;
    }

    return r;
}